

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

bool embree::avx2::ConeCurveMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  float fVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  byte bVar64;
  ulong uVar65;
  Scene *pSVar66;
  bool bVar67;
  ulong uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  float fVar80;
  float fVar82;
  float fVar84;
  float fVar86;
  float fVar88;
  float fVar90;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar73;
  undefined1 auVar77 [32];
  float fVar81;
  float fVar83;
  float fVar85;
  float fVar87;
  float fVar89;
  float fVar91;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar97;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar106;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar112;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar148;
  undefined1 auVar147 [64];
  undefined4 uVar149;
  float fVar150;
  float fVar156;
  float fVar157;
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  float fVar158;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar159 [28];
  float fVar162;
  float fVar163;
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar164 [64];
  float fVar165;
  undefined1 auVar166 [28];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  Scene *scene;
  RoundLineIntersectorHitM<8> hit;
  int local_564;
  RayQueryContext *local_560;
  float local_554;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  undefined4 local_540;
  undefined4 local_53c;
  uint local_538;
  uint local_534;
  uint local_530;
  RTCFilterFunctionNArguments local_520;
  Primitive *local_4f0;
  Scene *local_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [16];
  undefined1 auStack_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined8 local_440;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_150 [16];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  uint local_100 [4];
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  pSVar66 = context->scene;
  local_100[0] = line->sharedGeomID;
  uVar3 = (line->v0).field_0.i[0];
  pGVar11 = (pSVar66->geometries).items[local_100[0]].ptr;
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  uVar4 = (line->v0).field_0.i[1];
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[3];
  uVar7 = (line->v0).field_0.i[4];
  auVar79._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * (long)p_Var13);
  auVar79._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar3 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[5];
  auVar74._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * (long)p_Var13);
  auVar74._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar4 * (long)p_Var13);
  uVar9 = (line->v0).field_0.i[6];
  auVar92._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * (long)p_Var13);
  auVar92._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar5 * (long)p_Var13);
  uVar10 = (line->v0).field_0.i[7];
  auVar77._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar10 * (long)p_Var13);
  auVar77._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * (long)p_Var13);
  auVar69 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar107._0_16_ =
       ZEXT116(0) * auVar69 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar3 + 1) * (long)p_Var13);
  auVar107._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar69;
  auVar69 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar113._0_16_ =
       ZEXT116(0) * auVar69 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar4 + 1) * (long)p_Var13);
  auVar113._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar69;
  auVar69 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar124._0_16_ =
       ZEXT116(0) * auVar69 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar5 + 1) * (long)p_Var13);
  auVar124._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar69;
  auVar69 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar10 + 1) * (long)p_Var13);
  auVar132._0_16_ =
       ZEXT116(0) * auVar69 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar132._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar69;
  auVar182 = vunpcklps_avx(auVar79,auVar92);
  auVar102 = vunpckhps_avx(auVar79,auVar92);
  auVar117 = vunpcklps_avx(auVar74,auVar77);
  auVar178 = vunpckhps_avx(auVar74,auVar77);
  auVar76 = vunpcklps_avx(auVar182,auVar117);
  auVar182 = vunpckhps_avx(auVar182,auVar117);
  auVar108 = vunpcklps_avx(auVar102,auVar178);
  auVar117 = vunpckhps_avx(auVar102,auVar178);
  auVar102 = vpunpckldq_avx2(auVar107,auVar124);
  auVar74 = vpunpckhdq_avx2(auVar107,auVar124);
  auVar178 = vpunpckldq_avx2(auVar113,auVar132);
  auVar27 = vpunpckhdq_avx2(auVar113,auVar132);
  auVar77 = vpunpckldq_avx2(auVar102,auVar178);
  auVar92 = vpunpckhdq_avx2(auVar102,auVar178);
  auVar107 = vpunpckldq_avx2(auVar74,auVar27);
  uVar1 = line->leftExists;
  auVar102 = vpcmpeqd_avx2(auVar113,auVar113);
  auVar79 = vpcmpeqd_avx2(auVar102,(undefined1  [32])(line->primIDs).field_0);
  uVar2 = line->rightExists;
  local_100[1] = local_100[0];
  local_100[2] = local_100[0];
  local_100[3] = local_100[0];
  uStack_f0 = local_100[0];
  uStack_ec = local_100[0];
  uStack_e8 = local_100[0];
  uStack_e4 = local_100[0];
  auVar102._0_16_ = *(undefined1 (*) [16])&ray->dir;
  auVar102._16_4_ = ray->tfar;
  auVar102._20_4_ = ray->mask;
  auVar102._24_4_ = ray->id;
  auVar102._28_4_ = ray->flags;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *(ulong *)((long)&(ray->dir).field_0 + 0xc);
  uVar68 = *(ulong *)((long)&(ray->dir).field_0 + 4);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar68;
  auVar123 = vmovlhps_avx(auVar143,auVar123);
  auVar69._0_4_ = ray->tfar;
  auVar69._4_4_ = ray->mask;
  auVar69._8_4_ = ray->id;
  auVar69._12_4_ = ray->flags;
  auVar69 = vpalignr_avx(auVar69,auVar102._0_16_,8);
  auVar151._0_4_ = auVar69._0_4_ * auVar69._0_4_;
  auVar151._4_4_ = auVar69._4_4_ * auVar69._4_4_;
  auVar151._8_4_ = auVar69._8_4_ * auVar69._8_4_;
  auVar151._12_4_ = auVar69._12_4_ * auVar69._12_4_;
  auVar69 = vfmadd231ps_fma(auVar151,auVar123,auVar123);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar102,auVar102);
  uVar149 = auVar69._0_4_;
  auVar125._4_4_ = uVar149;
  auVar125._0_4_ = uVar149;
  auVar125._8_4_ = uVar149;
  auVar125._12_4_ = uVar149;
  auVar125._16_4_ = uVar149;
  auVar125._20_4_ = uVar149;
  auVar125._24_4_ = uVar149;
  auVar125._28_4_ = uVar149;
  auVar178 = vrcpps_avx(auVar125);
  auVar74 = vpunpckhdq_avx2(auVar74,auVar27);
  auVar75._8_4_ = 0x3f800000;
  auVar75._0_8_ = 0x3f8000003f800000;
  auVar75._12_4_ = 0x3f800000;
  auVar75._16_4_ = 0x3f800000;
  auVar75._20_4_ = 0x3f800000;
  auVar75._24_4_ = 0x3f800000;
  auVar75._28_4_ = 0x3f800000;
  auVar69 = vfnmadd213ps_fma(auVar125,auVar178,auVar75);
  auVar123 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar178,auVar178);
  auVar27._4_4_ = (auVar76._4_4_ + auVar77._4_4_) * 0.5;
  auVar27._0_4_ = (auVar76._0_4_ + auVar77._0_4_) * 0.5;
  auVar27._8_4_ = (auVar76._8_4_ + auVar77._8_4_) * 0.5;
  auVar27._12_4_ = (auVar76._12_4_ + auVar77._12_4_) * 0.5;
  auVar27._16_4_ = (auVar76._16_4_ + auVar77._16_4_) * 0.5;
  auVar27._20_4_ = (auVar76._20_4_ + auVar77._20_4_) * 0.5;
  auVar27._24_4_ = (auVar76._24_4_ + auVar77._24_4_) * 0.5;
  auVar27._28_4_ = auVar76._28_4_ + auVar77._28_4_;
  auVar178._4_4_ = (auVar92._4_4_ + auVar182._4_4_) * 0.5;
  auVar178._0_4_ = (auVar92._0_4_ + auVar182._0_4_) * 0.5;
  auVar178._8_4_ = (auVar92._8_4_ + auVar182._8_4_) * 0.5;
  auVar178._12_4_ = (auVar92._12_4_ + auVar182._12_4_) * 0.5;
  auVar178._16_4_ = (auVar92._16_4_ + auVar182._16_4_) * 0.5;
  auVar178._20_4_ = (auVar92._20_4_ + auVar182._20_4_) * 0.5;
  auVar178._24_4_ = (auVar92._24_4_ + auVar182._24_4_) * 0.5;
  auVar178._28_4_ = auVar92._28_4_ + auVar182._28_4_;
  auVar30._4_4_ = (auVar108._4_4_ + auVar107._4_4_) * 0.5;
  auVar30._0_4_ = (auVar108._0_4_ + auVar107._0_4_) * 0.5;
  auVar30._8_4_ = (auVar108._8_4_ + auVar107._8_4_) * 0.5;
  auVar30._12_4_ = (auVar108._12_4_ + auVar107._12_4_) * 0.5;
  auVar30._16_4_ = (auVar108._16_4_ + auVar107._16_4_) * 0.5;
  auVar30._20_4_ = (auVar108._20_4_ + auVar107._20_4_) * 0.5;
  auVar30._24_4_ = (auVar108._24_4_ + auVar107._24_4_) * 0.5;
  auVar30._28_4_ = 0x3f000000;
  fVar142 = (float)uVar68;
  local_120._4_4_ = fVar142;
  local_120._0_4_ = fVar142;
  fStack_118 = fVar142;
  fStack_114 = fVar142;
  fStack_110 = fVar142;
  fStack_10c = fVar142;
  fStack_108 = fVar142;
  register0x000014dc = fVar142;
  auVar69 = vshufps_avx(auVar102._0_16_,auVar102._0_16_,0xee);
  local_260 = auVar69._0_4_;
  fVar131 = (ray->org).field_0.m128[1];
  auVar144._4_4_ = fVar131;
  auVar144._0_4_ = fVar131;
  auVar144._8_4_ = fVar131;
  auVar144._12_4_ = fVar131;
  auVar144._16_4_ = fVar131;
  auVar144._20_4_ = fVar131;
  auVar144._24_4_ = fVar131;
  auVar144._28_4_ = fVar131;
  fVar136 = (ray->org).field_0.m128[2];
  auVar160._4_4_ = fVar136;
  auVar160._0_4_ = fVar136;
  auVar160._8_4_ = fVar136;
  auVar160._12_4_ = fVar136;
  auVar160._16_4_ = fVar136;
  auVar160._20_4_ = fVar136;
  auVar160._24_4_ = fVar136;
  auVar160._28_4_ = fVar136;
  auVar102 = vsubps_avx(auVar178,auVar144);
  auVar178 = vsubps_avx(auVar30,auVar160);
  auVar31._4_4_ = local_260 * auVar178._4_4_;
  auVar31._0_4_ = local_260 * auVar178._0_4_;
  auVar31._8_4_ = local_260 * auVar178._8_4_;
  auVar31._12_4_ = local_260 * auVar178._12_4_;
  auVar31._16_4_ = local_260 * auVar178._16_4_;
  auVar31._20_4_ = local_260 * auVar178._20_4_;
  auVar31._24_4_ = local_260 * auVar178._24_4_;
  auVar31._28_4_ = auVar178._28_4_;
  auVar69 = vfmadd231ps_fma(auVar31,_local_120,auVar102);
  fVar137 = (ray->org).field_0.m128[0];
  auVar114._4_4_ = fVar137;
  auVar114._0_4_ = fVar137;
  auVar114._8_4_ = fVar137;
  auVar114._12_4_ = fVar137;
  auVar114._16_4_ = fVar137;
  auVar114._20_4_ = fVar137;
  auVar114._24_4_ = fVar137;
  auVar114._28_4_ = fVar137;
  fVar138 = (ray->dir).field_0.m128[0];
  local_240._4_4_ = fVar138;
  local_240._0_4_ = fVar138;
  fStack_238 = fVar138;
  fStack_234 = fVar138;
  fStack_230 = fVar138;
  fStack_22c = fVar138;
  fStack_228 = fVar138;
  register0x0000155c = fVar138;
  auVar102 = vsubps_avx(auVar27,auVar114);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),_local_240,auVar102);
  fVar106 = auVar69._0_4_ * auVar123._0_4_;
  fVar109 = auVar69._4_4_ * auVar123._4_4_;
  fVar110 = auVar69._8_4_ * auVar123._8_4_;
  fVar111 = auVar69._12_4_ * auVar123._12_4_;
  local_420 = ZEXT1632(CONCAT412(fVar111,CONCAT48(fVar110,CONCAT44(fVar109,fVar106))));
  fVar139 = auVar102._28_4_;
  auVar115._0_4_ = fVar137 + fVar138 * fVar106;
  auVar115._4_4_ = fVar137 + fVar138 * fVar109;
  auVar115._8_4_ = fVar137 + fVar138 * fVar110;
  auVar115._12_4_ = fVar137 + fVar138 * fVar111;
  auVar115._16_4_ = fVar137 + fVar138 * 0.0;
  auVar115._20_4_ = fVar137 + fVar138 * 0.0;
  auVar115._24_4_ = fVar137 + fVar138 * 0.0;
  auVar115._28_4_ = fVar137 + fVar139;
  auVar152._0_4_ = fVar131 + fVar142 * fVar106;
  auVar152._4_4_ = fVar131 + fVar142 * fVar109;
  auVar152._8_4_ = fVar131 + fVar142 * fVar110;
  auVar152._12_4_ = fVar131 + fVar142 * fVar111;
  auVar152._16_4_ = fVar131 + fVar142 * 0.0;
  auVar152._20_4_ = fVar131 + fVar142 * 0.0;
  auVar152._24_4_ = fVar131 + fVar142 * 0.0;
  auVar152._28_4_ = fVar131 + fVar139;
  auVar126._0_4_ = fVar136 + local_260 * fVar106;
  auVar126._4_4_ = fVar136 + local_260 * fVar109;
  auVar126._8_4_ = fVar136 + local_260 * fVar110;
  auVar126._12_4_ = fVar136 + local_260 * fVar111;
  auVar126._16_4_ = fVar136 + local_260 * 0.0;
  auVar126._20_4_ = fVar136 + local_260 * 0.0;
  auVar126._24_4_ = fVar136 + local_260 * 0.0;
  auVar126._28_4_ = fVar136 + fVar139;
  local_140 = vsubps_avx(auVar77,auVar76);
  _local_460 = vsubps_avx(auVar115,auVar76);
  local_3e0 = vsubps_avx(auVar92,auVar182);
  _local_320 = vsubps_avx(auVar152,auVar182);
  local_360 = vsubps_avx(auVar107,auVar108);
  local_340 = vsubps_avx(auVar126,auVar108);
  fVar140 = local_360._0_4_;
  fVar169 = local_360._4_4_;
  auVar182._4_4_ = fVar169 * fVar169;
  auVar182._0_4_ = fVar140 * fVar140;
  fVar173 = local_360._8_4_;
  auVar182._8_4_ = fVar173 * fVar173;
  fVar16 = local_360._12_4_;
  auVar182._12_4_ = fVar16 * fVar16;
  fVar20 = local_360._16_4_;
  auVar182._16_4_ = fVar20 * fVar20;
  fVar23 = local_360._20_4_;
  auVar182._20_4_ = fVar23 * fVar23;
  fVar25 = local_360._24_4_;
  auVar182._24_4_ = fVar25 * fVar25;
  auVar182._28_4_ = 0;
  auVar69 = vfmadd231ps_fma(auVar182,local_3e0,local_3e0);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),local_140,local_140);
  fVar141 = local_340._0_4_;
  fVar170 = local_340._4_4_;
  auVar76._4_4_ = fVar169 * fVar170;
  auVar76._0_4_ = fVar140 * fVar141;
  fVar174 = local_340._8_4_;
  auVar76._8_4_ = fVar173 * fVar174;
  fVar17 = local_340._12_4_;
  auVar76._12_4_ = fVar16 * fVar17;
  fVar21 = local_340._16_4_;
  auVar76._16_4_ = fVar20 * fVar21;
  fVar24 = local_340._20_4_;
  auVar76._20_4_ = fVar23 * fVar24;
  fVar26 = local_340._24_4_;
  auVar76._24_4_ = fVar25 * fVar26;
  auVar76._28_4_ = fVar136;
  auVar123 = vfmadd231ps_fma(auVar76,_local_320,local_3e0);
  auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),_local_460,local_140);
  auVar108._4_4_ = local_260 * fVar169;
  auVar108._0_4_ = local_260 * fVar140;
  auVar108._8_4_ = local_260 * fVar173;
  auVar108._12_4_ = local_260 * fVar16;
  auVar108._16_4_ = local_260 * fVar20;
  auVar108._20_4_ = local_260 * fVar23;
  auVar108._24_4_ = local_260 * fVar25;
  auVar108._28_4_ = auVar152._28_4_;
  auVar143 = vfmadd231ps_fma(auVar108,_local_120,local_3e0);
  auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),_local_240,local_140);
  auVar102 = vsubps_avx(auVar117,auVar74);
  fVar148 = auVar102._0_4_;
  fVar171 = auVar102._4_4_;
  fVar14 = auVar102._8_4_;
  fVar18 = auVar102._12_4_;
  fVar22 = auVar102._16_4_;
  fVar162 = auVar102._20_4_;
  fVar163 = auVar102._24_4_;
  fVar131 = auVar69._0_4_;
  local_2a0 = fVar148 * fVar148 + fVar131;
  fVar136 = auVar69._4_4_;
  fStack_29c = fVar171 * fVar171 + fVar136;
  fVar137 = auVar69._8_4_;
  fStack_298 = fVar14 * fVar14 + fVar137;
  fVar139 = auVar69._12_4_;
  fStack_294 = fVar18 * fVar18 + fVar139;
  fStack_290 = fVar22 * fVar22 + 0.0;
  fStack_28c = fVar162 * fVar162 + 0.0;
  fStack_288 = fVar163 * fVar163 + 0.0;
  fStack_284 = auVar107._28_4_ + 0.0;
  auVar32._4_4_ = local_260 * fVar170;
  auVar32._0_4_ = local_260 * fVar141;
  auVar32._8_4_ = local_260 * fVar174;
  auVar32._12_4_ = local_260 * fVar17;
  auVar32._16_4_ = local_260 * fVar21;
  auVar32._20_4_ = local_260 * fVar24;
  auVar32._24_4_ = local_260 * fVar26;
  auVar32._28_4_ = auVar107._28_4_;
  auVar151 = vfmadd231ps_fma(auVar32,_local_120,_local_320);
  auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),_local_240,_local_460);
  fVar97 = fVar131 * fVar131;
  fVar103 = fVar136 * fVar136;
  fVar104 = fVar137 * fVar137;
  fVar105 = fVar139 * fVar139;
  local_280._28_4_ = local_3e0._28_4_;
  local_280._0_28_ = ZEXT1628(CONCAT412(fVar105,CONCAT48(fVar104,CONCAT44(fVar103,fVar97))));
  fVar165 = auVar123._0_4_;
  fVar150 = auVar143._0_4_;
  fVar172 = auVar123._4_4_;
  fVar156 = auVar143._4_4_;
  fVar15 = auVar123._8_4_;
  fVar157 = auVar143._8_4_;
  fVar19 = auVar123._12_4_;
  fVar158 = auVar143._12_4_;
  fVar33 = local_360._28_4_;
  auVar34._4_4_ = fStack_29c * fVar156 * fVar172;
  auVar34._0_4_ = local_2a0 * fVar150 * fVar165;
  auVar34._8_4_ = fStack_298 * fVar157 * fVar15;
  auVar34._12_4_ = fStack_294 * fVar158 * fVar19;
  auVar34._16_4_ = fStack_290 * 0.0;
  auVar34._20_4_ = fStack_28c * 0.0;
  auVar34._24_4_ = fStack_288 * 0.0;
  auVar34._28_4_ = fVar33;
  auVar178 = vsubps_avx(ZEXT1632(CONCAT412(fVar105 * auVar151._12_4_,
                                           CONCAT48(fVar104 * auVar151._8_4_,
                                                    CONCAT44(fVar103 * auVar151._4_4_,
                                                             fVar97 * auVar151._0_4_)))),auVar34);
  auVar108 = ZEXT1632(auVar69);
  fVar73 = auVar117._0_4_;
  fVar72 = fVar73 * fVar131;
  fVar81 = auVar117._4_4_;
  fVar80 = fVar81 * fVar136;
  auVar35._4_4_ = fVar80;
  auVar35._0_4_ = fVar72;
  fVar83 = auVar117._8_4_;
  fVar82 = fVar83 * fVar137;
  auVar35._8_4_ = fVar82;
  fVar85 = auVar117._12_4_;
  fVar84 = fVar85 * fVar139;
  auVar35._12_4_ = fVar84;
  fVar87 = auVar117._16_4_;
  fVar86 = fVar87 * 0.0;
  auVar35._16_4_ = fVar86;
  fVar89 = auVar117._20_4_;
  fVar88 = fVar89 * 0.0;
  auVar35._20_4_ = fVar88;
  fVar91 = auVar117._24_4_;
  fVar90 = fVar91 * 0.0;
  auVar35._24_4_ = fVar90;
  auVar35._28_4_ = fVar33;
  auVar93._0_4_ = fVar72 * fVar150 * fVar148 + auVar178._0_4_;
  auVar93._4_4_ = fVar80 * fVar156 * fVar171 + auVar178._4_4_;
  auVar93._8_4_ = fVar82 * fVar157 * fVar14 + auVar178._8_4_;
  auVar93._12_4_ = fVar84 * fVar158 * fVar18 + auVar178._12_4_;
  auVar93._16_4_ = fVar86 * fVar22 * 0.0 + auVar178._16_4_;
  auVar93._20_4_ = fVar88 * fVar162 * 0.0 + auVar178._20_4_;
  auVar93._24_4_ = fVar90 * fVar163 * 0.0 + auVar178._24_4_;
  auVar93._28_4_ = auVar117._28_4_ + auVar178._28_4_;
  auVar117._4_4_ = fVar170 * fVar170;
  auVar117._0_4_ = fVar141 * fVar141;
  auVar117._8_4_ = fVar174 * fVar174;
  auVar117._12_4_ = fVar17 * fVar17;
  auVar117._16_4_ = fVar21 * fVar21;
  auVar117._20_4_ = fVar24 * fVar24;
  auVar117._24_4_ = fVar26 * fVar26;
  auVar117._28_4_ = auVar178._28_4_;
  auVar69 = vfmadd231ps_fma(auVar117,_local_320,_local_320);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),_local_460,_local_460);
  auVar36._4_4_ = fStack_29c * fVar172 * fVar172;
  auVar36._0_4_ = local_2a0 * fVar165 * fVar165;
  auVar36._8_4_ = fStack_298 * fVar15 * fVar15;
  auVar36._12_4_ = fStack_294 * fVar19 * fVar19;
  auVar36._16_4_ = fStack_290 * 0.0;
  auVar36._20_4_ = fStack_28c * 0.0;
  auVar36._24_4_ = fStack_288 * 0.0;
  auVar36._28_4_ = local_460._28_4_;
  auVar178 = vsubps_avx(ZEXT1632(CONCAT412(fVar105 * auVar69._12_4_,
                                           CONCAT48(fVar104 * auVar69._8_4_,
                                                    CONCAT44(fVar103 * auVar69._4_4_,
                                                             fVar97 * auVar69._0_4_)))),auVar36);
  auVar37._4_4_ = (fVar171 + fVar171) * fVar172;
  auVar37._0_4_ = (fVar148 + fVar148) * fVar165;
  auVar37._8_4_ = (fVar14 + fVar14) * fVar15;
  auVar37._12_4_ = (fVar18 + fVar18) * fVar19;
  auVar37._16_4_ = (fVar22 + fVar22) * 0.0;
  auVar37._20_4_ = (fVar162 + fVar162) * 0.0;
  auVar37._24_4_ = (fVar163 + fVar163) * 0.0;
  auVar37._28_4_ = auVar102._28_4_ + auVar102._28_4_;
  auVar102 = vsubps_avx(auVar37,auVar35);
  fVar112 = fVar150 * fVar150;
  fVar120 = fVar156 * fVar156;
  fVar121 = fVar157 * fVar157;
  fVar122 = fVar158 * fVar158;
  auVar38._4_4_ = fStack_29c * fVar120;
  auVar38._0_4_ = local_2a0 * fVar112;
  auVar38._8_4_ = fStack_298 * fVar121;
  auVar38._12_4_ = fStack_294 * fVar122;
  auVar38._16_4_ = fStack_290 * 0.0;
  auVar38._20_4_ = fStack_28c * 0.0;
  auVar38._24_4_ = fStack_288 * 0.0;
  auVar38._28_4_ = auVar178._28_4_;
  auVar182 = vsubps_avx(local_280,auVar38);
  auVar39._4_4_ = auVar182._4_4_ * (auVar178._4_4_ + auVar102._4_4_ * fVar80);
  auVar39._0_4_ = auVar182._0_4_ * (auVar178._0_4_ + auVar102._0_4_ * fVar72);
  auVar39._8_4_ = auVar182._8_4_ * (auVar178._8_4_ + auVar102._8_4_ * fVar82);
  auVar39._12_4_ = auVar182._12_4_ * (auVar178._12_4_ + auVar102._12_4_ * fVar84);
  auVar39._16_4_ = auVar182._16_4_ * (auVar178._16_4_ + auVar102._16_4_ * fVar86);
  auVar39._20_4_ = auVar182._20_4_ * (auVar178._20_4_ + auVar102._20_4_ * fVar88);
  auVar39._24_4_ = auVar182._24_4_ * (auVar178._24_4_ + auVar102._24_4_ * fVar90);
  auVar39._28_4_ = auVar178._28_4_ + fVar33;
  auVar40._4_4_ = auVar93._4_4_ * auVar93._4_4_;
  auVar40._0_4_ = auVar93._0_4_ * auVar93._0_4_;
  auVar40._8_4_ = auVar93._8_4_ * auVar93._8_4_;
  auVar40._12_4_ = auVar93._12_4_ * auVar93._12_4_;
  auVar40._16_4_ = auVar93._16_4_ * auVar93._16_4_;
  auVar40._20_4_ = auVar93._20_4_ * auVar93._20_4_;
  auVar40._24_4_ = auVar93._24_4_ * auVar93._24_4_;
  auVar40._28_4_ = auVar102._28_4_;
  auVar178 = vsubps_avx(auVar40,auVar39);
  auVar76 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar102 = vcmpps_avx(auVar178,auVar76,5);
  auVar117 = auVar102 & ~auVar79;
  if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar117 >> 0x7f,0) != '\0') ||
        (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar117 >> 0xbf,0) != '\0') ||
      (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar117[0x1f] < '\0')
  {
    auVar102 = vandnps_avx(auVar79,auVar102);
    auVar69 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
    auVar27 = vsubps_avx(auVar115,auVar77);
    auVar79 = vsubps_avx(auVar152,auVar92);
    auVar92 = vsubps_avx(auVar126,auVar107);
    auVar98._2_2_ = 0;
    auVar98._0_2_ = uVar2;
    auVar98._4_2_ = uVar2;
    auVar98._6_2_ = 0;
    auVar98._8_2_ = uVar2;
    auVar98._10_2_ = 0;
    auVar98._12_2_ = uVar2;
    auVar98._14_2_ = 0;
    auVar98._16_2_ = uVar2;
    auVar98._18_2_ = 0;
    auVar98._20_2_ = uVar2;
    auVar98._22_2_ = 0;
    auVar98._24_2_ = uVar2;
    auVar98._26_2_ = 0;
    auVar98._28_2_ = uVar2;
    auVar98._30_2_ = 0;
    auVar77 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar102 = vpand_avx2(auVar98,auVar77);
    auVar102 = vpcmpeqd_avx2(auVar102,auVar76);
    auVar123 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
    auVar99._2_2_ = 0;
    auVar99._0_2_ = uVar1;
    auVar99._4_2_ = uVar1;
    auVar99._6_2_ = 0;
    auVar99._8_2_ = uVar1;
    auVar99._10_2_ = 0;
    auVar99._12_2_ = uVar1;
    auVar99._14_2_ = 0;
    auVar99._16_2_ = uVar1;
    auVar99._18_2_ = 0;
    auVar99._20_2_ = uVar1;
    auVar99._22_2_ = 0;
    auVar99._24_2_ = uVar1;
    auVar99._26_2_ = 0;
    auVar99._28_2_ = uVar1;
    auVar99._30_2_ = 0;
    auVar117 = vsqrtps_avx(auVar178);
    auVar76 = vpand_avx2(auVar99,auVar77);
    auVar102 = vrcpps_avx(auVar182);
    auVar176._8_4_ = 0x3f800000;
    auVar176._0_8_ = 0x3f8000003f800000;
    auVar176._12_4_ = 0x3f800000;
    auVar176._16_4_ = 0x3f800000;
    auVar176._20_4_ = 0x3f800000;
    auVar176._24_4_ = 0x3f800000;
    auVar176._28_4_ = 0x3f800000;
    auVar151 = vfnmadd213ps_fma(auVar102,auVar182,auVar176);
    auVar133._8_4_ = 0x7fffffff;
    auVar133._0_8_ = 0x7fffffff7fffffff;
    auVar133._12_4_ = 0x7fffffff;
    auVar133._16_4_ = 0x7fffffff;
    auVar133._20_4_ = 0x7fffffff;
    auVar133._24_4_ = 0x7fffffff;
    auVar133._28_4_ = 0x7fffffff;
    auVar151 = vfmadd132ps_fma(ZEXT1632(auVar151),auVar102,auVar102);
    auVar102 = vandps_avx(auVar182,auVar133);
    auVar100._8_4_ = 0x219392ef;
    auVar100._0_8_ = 0x219392ef219392ef;
    auVar100._12_4_ = 0x219392ef;
    auVar100._16_4_ = 0x219392ef;
    auVar100._20_4_ = 0x219392ef;
    auVar100._24_4_ = 0x219392ef;
    auVar100._28_4_ = 0x219392ef;
    auVar102 = vcmpps_avx(auVar102,auVar100,2);
    uVar68 = CONCAT44(auVar93._4_4_,auVar93._0_4_);
    auVar70._0_8_ = uVar68 ^ 0x8000000080000000;
    auVar70._8_4_ = -auVar93._8_4_;
    auVar70._12_4_ = -auVar93._12_4_;
    auVar70._16_4_ = -auVar93._16_4_;
    auVar70._20_4_ = -auVar93._20_4_;
    auVar70._24_4_ = -auVar93._24_4_;
    auVar70._28_4_ = -auVar93._28_4_;
    auVar178 = vsubps_avx(auVar70,auVar117);
    auVar182 = vsubps_avx(auVar117,auVar93);
    auVar41._4_4_ = auVar151._4_4_ * auVar178._4_4_;
    auVar41._0_4_ = auVar151._0_4_ * auVar178._0_4_;
    auVar41._8_4_ = auVar151._8_4_ * auVar178._8_4_;
    auVar41._12_4_ = auVar151._12_4_ * auVar178._12_4_;
    auVar41._16_4_ = auVar178._16_4_ * 0.0;
    auVar41._20_4_ = auVar178._20_4_ * 0.0;
    auVar41._24_4_ = auVar178._24_4_ * 0.0;
    auVar41._28_4_ = auVar117._28_4_;
    auVar180._0_4_ = auVar151._0_4_ * auVar182._0_4_;
    auVar180._4_4_ = auVar151._4_4_ * auVar182._4_4_;
    auVar180._8_4_ = auVar151._8_4_ * auVar182._8_4_;
    auVar180._12_4_ = auVar151._12_4_ * auVar182._12_4_;
    auVar180._16_4_ = auVar182._16_4_ * 0.0;
    auVar180._20_4_ = auVar182._20_4_ * 0.0;
    auVar180._24_4_ = auVar182._24_4_ * 0.0;
    auVar180._28_4_ = 0;
    auVar94._8_4_ = 0xff800000;
    auVar94._0_8_ = 0xff800000ff800000;
    auVar94._12_4_ = 0xff800000;
    auVar94._16_4_ = 0xff800000;
    auVar94._20_4_ = 0xff800000;
    auVar94._24_4_ = 0xff800000;
    auVar94._28_4_ = 0xff800000;
    auVar178 = vblendvps_avx(auVar41,auVar94,auVar102);
    auVar95._8_4_ = 0x7f800000;
    auVar95._0_8_ = 0x7f8000007f800000;
    auVar95._12_4_ = 0x7f800000;
    auVar95._16_4_ = 0x7f800000;
    auVar95._20_4_ = 0x7f800000;
    auVar95._24_4_ = 0x7f800000;
    auVar95._28_4_ = 0x7f800000;
    auVar182 = vblendvps_avx(auVar180,auVar95,auVar102);
    auVar127._0_4_ = fVar165 + fVar150 * auVar178._0_4_;
    auVar127._4_4_ = fVar172 + fVar156 * auVar178._4_4_;
    auVar127._8_4_ = fVar15 + fVar157 * auVar178._8_4_;
    auVar127._12_4_ = fVar19 + fVar158 * auVar178._12_4_;
    auVar127._16_4_ = auVar178._16_4_ * 0.0 + 0.0;
    auVar127._20_4_ = auVar178._20_4_ * 0.0 + 0.0;
    auVar127._24_4_ = auVar178._24_4_ * 0.0 + 0.0;
    auVar127._28_4_ = auVar117._28_4_ + 0.0;
    auVar77 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar102 = vcmpps_avx(auVar127,auVar77,6);
    auVar117 = vcmpps_avx(auVar127,auVar108,1);
    auVar102 = vandps_avx(auVar102,auVar117);
    auVar151 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
    auVar151 = vpand_avx(auVar69,auVar151);
    auVar102 = vpmovsxwd_avx2(auVar151);
    local_480 = vblendvps_avx(auVar95,auVar178,auVar102);
    auVar117 = vpcmpeqd_avx2(auVar76,auVar77);
    local_3a0._0_4_ = fVar165 + fVar150 * auVar182._0_4_;
    local_3a0._4_4_ = fVar172 + fVar156 * auVar182._4_4_;
    fStack_398 = fVar15 + fVar157 * auVar182._8_4_;
    fStack_394 = fVar19 + fVar158 * auVar182._12_4_;
    fStack_390 = auVar182._16_4_ * 0.0 + 0.0;
    fStack_38c = auVar182._20_4_ * 0.0 + 0.0;
    fStack_388 = auVar182._24_4_ * 0.0 + 0.0;
    register0x0000129c = auVar102._28_4_ + 0.0;
    auVar102 = vcmpps_avx(_local_3a0,auVar77,6);
    auVar178 = vcmpps_avx(_local_3a0,auVar108,1);
    auVar102 = vandps_avx(auVar178,auVar102);
    auVar151 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
    auVar151 = vpand_avx(auVar69,auVar151);
    auVar102 = vpmovsxwd_avx2(auVar151);
    local_380 = vblendvps_avx(auVar94,auVar182,auVar102);
    auVar151 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
    auVar102 = vrcpps_avx(ZEXT1632(auVar143));
    auVar143 = vfnmadd213ps_fma(auVar102,ZEXT1632(auVar143),auVar176);
    auVar29 = vfmadd132ps_fma(ZEXT1632(auVar143),auVar102,auVar102);
    auVar42._4_4_ = fVar156 * (float)local_460._4_4_;
    auVar42._0_4_ = fVar150 * (float)local_460._0_4_;
    auVar42._8_4_ = fVar157 * fStack_458;
    auVar42._12_4_ = fVar158 * fStack_454;
    auVar42._16_4_ = fStack_450 * 0.0;
    auVar42._20_4_ = fStack_44c * 0.0;
    auVar42._24_4_ = fStack_448 * 0.0;
    auVar42._28_4_ = auVar102._28_4_;
    auVar128._0_4_ = fVar138 * fVar165;
    auVar128._4_4_ = fVar138 * fVar172;
    auVar128._8_4_ = fVar138 * fVar15;
    auVar128._12_4_ = fVar138 * fVar19;
    auVar128._16_4_ = fVar138 * 0.0;
    auVar128._20_4_ = fVar138 * 0.0;
    auVar128._24_4_ = fVar138 * 0.0;
    auVar128._28_4_ = 0;
    auVar102 = vsubps_avx(auVar42,auVar128);
    auVar43._4_4_ = fVar156 * (float)local_320._4_4_;
    auVar43._0_4_ = fVar150 * (float)local_320._0_4_;
    auVar43._8_4_ = fVar157 * fStack_318;
    auVar43._12_4_ = fVar158 * fStack_314;
    auVar43._16_4_ = fStack_310 * 0.0;
    auVar43._20_4_ = fStack_30c * 0.0;
    auVar43._24_4_ = fStack_308 * 0.0;
    auVar43._28_4_ = 0;
    auVar44._4_4_ = fVar142 * fVar172;
    auVar44._0_4_ = fVar142 * fVar165;
    auVar44._8_4_ = fVar142 * fVar15;
    auVar44._12_4_ = fVar142 * fVar19;
    auVar44._16_4_ = fVar142 * 0.0;
    auVar44._20_4_ = fVar142 * 0.0;
    auVar44._24_4_ = fVar142 * 0.0;
    auVar44._28_4_ = auVar76._28_4_;
    auVar178 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = fVar156 * fVar170;
    auVar45._0_4_ = fVar150 * fVar141;
    auVar45._8_4_ = fVar157 * fVar174;
    auVar45._12_4_ = fVar158 * fVar17;
    auVar45._16_4_ = fVar21 * 0.0;
    auVar45._20_4_ = fVar24 * 0.0;
    auVar45._24_4_ = fVar26 * 0.0;
    auVar45._28_4_ = auVar76._28_4_;
    auVar181._0_4_ = local_260 * fVar165;
    auVar181._4_4_ = local_260 * fVar172;
    auVar181._8_4_ = local_260 * fVar15;
    auVar181._12_4_ = local_260 * fVar19;
    auVar181._16_4_ = local_260 * 0.0;
    auVar181._20_4_ = local_260 * 0.0;
    auVar181._24_4_ = local_260 * 0.0;
    auVar181._28_4_ = 0;
    auVar182 = vsubps_avx(auVar45,auVar181);
    auVar46._4_4_ = auVar182._4_4_ * auVar182._4_4_;
    auVar46._0_4_ = auVar182._0_4_ * auVar182._0_4_;
    auVar46._8_4_ = auVar182._8_4_ * auVar182._8_4_;
    auVar46._12_4_ = auVar182._12_4_ * auVar182._12_4_;
    auVar46._16_4_ = auVar182._16_4_ * auVar182._16_4_;
    auVar46._20_4_ = auVar182._20_4_ * auVar182._20_4_;
    auVar46._24_4_ = auVar182._24_4_ * auVar182._24_4_;
    auVar46._28_4_ = auVar182._28_4_;
    auVar143 = vfmadd231ps_fma(auVar46,auVar178,auVar178);
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar102,auVar102);
    auVar47._4_4_ = fVar81 * fVar81 * fVar120;
    auVar47._0_4_ = fVar73 * fVar73 * fVar112;
    auVar47._8_4_ = fVar83 * fVar83 * fVar121;
    auVar47._12_4_ = fVar85 * fVar85 * fVar122;
    auVar47._16_4_ = fVar87 * fVar87 * 0.0;
    auVar47._20_4_ = fVar89 * fVar89 * 0.0;
    auVar47._24_4_ = fVar91 * fVar91 * 0.0;
    auVar47._28_4_ = auVar102._28_4_;
    auVar102 = vcmpps_avx(ZEXT1632(auVar143),auVar47,1);
    auVar143 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
    auVar143 = vpand_avx(auVar151,auVar143);
    auVar48._4_4_ = auVar29._4_4_ * -fVar172;
    auVar48._0_4_ = auVar29._0_4_ * -fVar165;
    auVar48._8_4_ = auVar29._8_4_ * -fVar15;
    auVar48._12_4_ = auVar29._12_4_ * -fVar19;
    auVar48._16_4_ = 0x80000000;
    auVar48._20_4_ = 0x80000000;
    auVar48._24_4_ = 0x80000000;
    auVar48._28_4_ = 0x80000000;
    auVar143 = vpand_avx(auVar69,auVar143);
    auVar102 = vpmovsxwd_avx2(auVar143);
    auVar167._8_4_ = 0x7f800000;
    auVar167._0_8_ = 0x7f8000007f800000;
    auVar167._12_4_ = 0x7f800000;
    auVar167._16_4_ = 0x7f800000;
    auVar167._20_4_ = 0x7f800000;
    auVar167._24_4_ = 0x7f800000;
    auVar167._28_4_ = 0x7f800000;
    auVar178 = vblendvps_avx(auVar167,auVar48,auVar102);
    auVar49._4_4_ = auVar92._4_4_ * fVar169;
    auVar49._0_4_ = auVar92._0_4_ * fVar140;
    auVar49._8_4_ = auVar92._8_4_ * fVar173;
    auVar49._12_4_ = auVar92._12_4_ * fVar16;
    auVar49._16_4_ = auVar92._16_4_ * fVar20;
    auVar49._20_4_ = auVar92._20_4_ * fVar23;
    auVar49._24_4_ = auVar92._24_4_ * fVar25;
    auVar49._28_4_ = auVar102._28_4_;
    auVar143 = vfmadd231ps_fma(auVar49,auVar79,local_3e0);
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar27,local_140);
    auVar50._4_4_ = fVar156 * auVar27._4_4_;
    auVar50._0_4_ = fVar150 * auVar27._0_4_;
    auVar50._8_4_ = fVar157 * auVar27._8_4_;
    auVar50._12_4_ = fVar158 * auVar27._12_4_;
    auVar50._16_4_ = auVar27._16_4_ * 0.0;
    auVar50._20_4_ = auVar27._20_4_ * 0.0;
    auVar50._24_4_ = auVar27._24_4_ * 0.0;
    auVar50._28_4_ = auVar27._28_4_;
    auVar51._4_4_ = fVar156 * auVar79._4_4_;
    auVar51._0_4_ = fVar150 * auVar79._0_4_;
    auVar51._8_4_ = fVar157 * auVar79._8_4_;
    auVar51._12_4_ = fVar158 * auVar79._12_4_;
    auVar51._16_4_ = auVar79._16_4_ * 0.0;
    auVar51._20_4_ = auVar79._20_4_ * 0.0;
    auVar51._24_4_ = auVar79._24_4_ * 0.0;
    auVar51._28_4_ = auVar79._28_4_;
    auVar52._4_4_ = fVar156 * auVar92._4_4_;
    auVar52._0_4_ = fVar150 * auVar92._0_4_;
    auVar52._8_4_ = fVar157 * auVar92._8_4_;
    auVar52._12_4_ = fVar158 * auVar92._12_4_;
    auVar52._16_4_ = auVar92._16_4_ * 0.0;
    auVar52._20_4_ = auVar92._20_4_ * 0.0;
    auVar52._24_4_ = auVar92._24_4_ * 0.0;
    auVar52._28_4_ = auVar92._28_4_;
    fVar165 = auVar143._0_4_;
    auVar153._0_4_ = fVar138 * fVar165;
    fVar172 = auVar143._4_4_;
    auVar153._4_4_ = fVar138 * fVar172;
    fVar15 = auVar143._8_4_;
    auVar153._8_4_ = fVar138 * fVar15;
    fVar19 = auVar143._12_4_;
    auVar153._12_4_ = fVar138 * fVar19;
    auVar153._16_4_ = fVar138 * 0.0;
    auVar153._20_4_ = fVar138 * 0.0;
    auVar153._24_4_ = fVar138 * 0.0;
    auVar153._28_4_ = 0;
    auVar102 = vsubps_avx(auVar50,auVar153);
    auVar53._4_4_ = fVar142 * fVar172;
    auVar53._0_4_ = fVar142 * fVar165;
    auVar53._8_4_ = fVar142 * fVar15;
    auVar53._12_4_ = fVar142 * fVar19;
    auVar53._16_4_ = fVar142 * 0.0;
    auVar53._20_4_ = fVar142 * 0.0;
    auVar53._24_4_ = fVar142 * 0.0;
    auVar53._28_4_ = 0;
    auVar182 = vsubps_avx(auVar51,auVar53);
    auVar54._4_4_ = local_260 * fVar172;
    auVar54._0_4_ = local_260 * fVar165;
    auVar54._8_4_ = local_260 * fVar15;
    auVar54._12_4_ = local_260 * fVar19;
    auVar54._16_4_ = local_260 * 0.0;
    auVar54._20_4_ = local_260 * 0.0;
    auVar54._24_4_ = local_260 * 0.0;
    auVar54._28_4_ = 0;
    auVar117 = vsubps_avx(auVar52,auVar54);
    auVar55._4_4_ = auVar117._4_4_ * auVar117._4_4_;
    auVar55._0_4_ = auVar117._0_4_ * auVar117._0_4_;
    auVar55._8_4_ = auVar117._8_4_ * auVar117._8_4_;
    auVar55._12_4_ = auVar117._12_4_ * auVar117._12_4_;
    auVar55._16_4_ = auVar117._16_4_ * auVar117._16_4_;
    auVar55._20_4_ = auVar117._20_4_ * auVar117._20_4_;
    auVar55._24_4_ = auVar117._24_4_ * auVar117._24_4_;
    auVar55._28_4_ = 0;
    auVar143 = vfmadd231ps_fma(auVar55,auVar182,auVar182);
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar102,auVar102);
    local_400._0_4_ = auVar74._0_4_;
    local_400._4_4_ = auVar74._4_4_;
    fStack_3f8 = auVar74._8_4_;
    fStack_3f4 = auVar74._12_4_;
    fStack_3f0 = auVar74._16_4_;
    fStack_3ec = auVar74._20_4_;
    fStack_3e8 = auVar74._24_4_;
    uStack_3e4 = auVar74._28_4_;
    auVar56._4_4_ = (float)local_400._4_4_ * (float)local_400._4_4_ * fVar120;
    auVar56._0_4_ = (float)local_400._0_4_ * (float)local_400._0_4_ * fVar112;
    auVar56._8_4_ = fStack_3f8 * fStack_3f8 * fVar121;
    auVar56._12_4_ = fStack_3f4 * fStack_3f4 * fVar122;
    auVar56._16_4_ = fStack_3f0 * fStack_3f0 * 0.0;
    auVar56._20_4_ = fStack_3ec * fStack_3ec * 0.0;
    auVar56._24_4_ = fStack_3e8 * fStack_3e8 * 0.0;
    auVar56._28_4_ = uStack_3e4;
    uVar149 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar116._4_4_ = uVar149;
    auVar116._0_4_ = uVar149;
    auVar116._8_4_ = uVar149;
    auVar116._12_4_ = uVar149;
    auVar116._16_4_ = uVar149;
    auVar116._20_4_ = uVar149;
    auVar116._24_4_ = uVar149;
    auVar116._28_4_ = uVar149;
    auVar102 = vcmpps_avx(ZEXT1632(auVar143),auVar56,1);
    auVar143 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
    auVar123 = vpand_avx(auVar143,auVar123);
    auVar57._4_4_ = auVar29._4_4_ * -fVar172;
    auVar57._0_4_ = auVar29._0_4_ * -fVar165;
    auVar57._8_4_ = auVar29._8_4_ * -fVar15;
    auVar57._12_4_ = auVar29._12_4_ * -fVar19;
    auVar57._16_4_ = 0x80000000;
    auVar57._20_4_ = 0x80000000;
    auVar57._24_4_ = 0x80000000;
    auVar57._28_4_ = 0x80000000;
    auVar123 = vpand_avx(auVar69,auVar123);
    auVar102 = vpmovsxwd_avx2(auVar123);
    auVar102 = vblendvps_avx(auVar167,auVar57,auVar102);
    auVar76 = vminps_avx(auVar178,auVar102);
    auVar182 = vmaxps_avx(auVar178,auVar102);
    auVar79 = vminps_avx(local_480,auVar76);
    auVar117 = vcmpps_avx(auVar79,auVar76,0);
    auVar102 = vcmpps_avx(auVar167,auVar182,0);
    auVar96._8_4_ = 0xff800000;
    auVar96._0_8_ = 0xff800000ff800000;
    auVar96._12_4_ = 0xff800000;
    auVar96._16_4_ = 0xff800000;
    auVar96._20_4_ = 0xff800000;
    auVar96._24_4_ = 0xff800000;
    auVar96._28_4_ = 0xff800000;
    auVar102 = vblendvps_avx(auVar182,auVar96,auVar102);
    auVar182 = vcmpps_avx(auVar167,auVar76,0);
    auVar182 = vblendvps_avx(auVar76,auVar96,auVar182);
    auVar182 = vblendvps_avx(auVar182,auVar102,auVar117);
    auVar101._0_4_ = fVar106 + auVar79._0_4_;
    auVar101._4_4_ = fVar109 + auVar79._4_4_;
    auVar101._8_4_ = fVar110 + auVar79._8_4_;
    auVar101._12_4_ = fVar111 + auVar79._12_4_;
    auVar101._16_4_ = auVar79._16_4_ + 0.0;
    auVar101._20_4_ = auVar79._20_4_ + 0.0;
    auVar101._24_4_ = auVar79._24_4_ + 0.0;
    auVar101._28_4_ = auVar79._28_4_ + 0.0;
    auVar102 = vcmpps_avx(auVar116,auVar101,2);
    fStack_424 = ray->tfar;
    auVar154._4_4_ = fStack_424;
    auVar154._0_4_ = fStack_424;
    auVar154._8_4_ = fStack_424;
    auVar154._12_4_ = fStack_424;
    auVar154._16_4_ = fStack_424;
    auVar154._20_4_ = fStack_424;
    auVar154._24_4_ = fStack_424;
    auVar154._28_4_ = fStack_424;
    auVar117 = vcmpps_avx(auVar101,auVar154,2);
    auVar102 = vandps_avx(auVar102,auVar117);
    local_2e0 = vmaxps_avx(local_380,auVar182);
    auVar182 = vcmpps_avx(auVar167,auVar79,4);
    auVar102 = vandps_avx(auVar102,auVar182);
    auVar123 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
    local_4c0 = vpand_avx(auVar69,auVar123);
    local_4a0._0_4_ = fVar106 + local_2e0._0_4_;
    local_4a0._4_4_ = fVar109 + local_2e0._4_4_;
    local_4a0._8_4_ = fVar110 + local_2e0._8_4_;
    local_4a0._12_4_ = fVar111 + local_2e0._12_4_;
    local_4a0._16_4_ = local_2e0._16_4_ + 0.0;
    local_4a0._20_4_ = local_2e0._20_4_ + 0.0;
    local_4a0._24_4_ = local_2e0._24_4_ + 0.0;
    local_4a0._28_4_ = local_2e0._28_4_ + 0.0;
    auVar102 = vcmpps_avx(auVar116,local_4a0,2);
    auVar182 = vcmpps_avx(local_4a0,auVar154,2);
    auVar102 = vandps_avx(auVar102,auVar182);
    auVar182 = vcmpps_avx(auVar96,local_2e0,4);
    auVar102 = vandps_avx(auVar102,auVar182);
    auVar123 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
    local_150 = vpand_avx(auVar69,auVar123);
    auVar123 = vpor_avx(local_4c0,local_150);
    auVar102 = vpmovsxwd_avx2(auVar123);
    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar102 >> 0x7f,0) != '\0') ||
          (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar102 >> 0xbf,0) != '\0') ||
        (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar102[0x1f] < '\0') {
      auStack_4b0 = auVar27._16_16_;
      auVar102 = vpmovzxwd_avx2(local_4c0);
      auVar102 = vpslld_avx2(auVar102,0x1f);
      auVar182 = vblendvps_avx(local_2e0,auVar79,auVar102);
      local_3c0._0_16_ = auVar123;
      auVar102 = vblendvps_avx(_local_3a0,auVar127,auVar102);
      auVar79 = vrcpps_avx(auVar108);
      auVar177._8_4_ = 0x3f800000;
      auVar177._0_8_ = 0x3f8000003f800000;
      auVar177._12_4_ = 0x3f800000;
      auVar177._16_4_ = 0x3f800000;
      auVar177._20_4_ = 0x3f800000;
      auVar177._24_4_ = 0x3f800000;
      auVar177._28_4_ = 0x3f800000;
      auVar143 = vfnmadd213ps_fma(auVar79,auVar108,auVar177);
      auVar29 = vfmadd132ps_fma(ZEXT1632(auVar143),auVar79,auVar79);
      fVar73 = fVar131 * fVar148 * fVar73;
      fVar81 = fVar136 * fVar171 * fVar81;
      fVar83 = fVar137 * fVar14 * fVar83;
      fVar85 = fVar139 * fVar18 * fVar85;
      fVar87 = fVar22 * 0.0 * fVar87;
      fVar89 = fVar162 * 0.0 * fVar89;
      fVar91 = fVar163 * 0.0 * fVar91;
      local_440._0_4_ = local_140._0_4_ * fVar73;
      local_440._4_4_ = local_140._4_4_ * fVar81;
      fVar84 = local_140._8_4_;
      fVar86 = local_140._12_4_;
      fVar88 = local_140._16_4_;
      fVar90 = local_140._20_4_;
      fVar112 = local_140._24_4_;
      local_2c0 = local_3e0._0_4_ * fVar73;
      fStack_2bc = local_3e0._4_4_ * fVar81;
      fVar162 = local_3e0._8_4_;
      fVar163 = local_3e0._12_4_;
      fVar72 = local_3e0._16_4_;
      fVar80 = local_3e0._20_4_;
      fVar82 = local_3e0._24_4_;
      local_300 = local_140._0_4_ * local_2a0;
      fStack_2fc = local_140._4_4_ * fStack_29c;
      auVar117 = vcmpps_avx(auVar182,local_480,0);
      auVar76 = vcmpps_avx(auVar182,local_380,0);
      auVar117 = vorps_avx(auVar117,auVar76);
      auVar143 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
      auVar151 = vpand_avx(auVar69,auVar143);
      auVar117 = vcmpps_avx(auVar182,auVar178,0);
      auVar143 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
      auVar69 = vpand_avx(auVar69,auVar143);
      fVar131 = auVar182._0_4_;
      fVar137 = auVar182._4_4_;
      fVar139 = auVar182._8_4_;
      fVar165 = auVar182._12_4_;
      fVar172 = auVar182._16_4_;
      fVar15 = auVar182._20_4_;
      fVar19 = auVar182._24_4_;
      auVar168 = ZEXT3264(local_280);
      fStack_438 = fVar84 * fVar83;
      fStack_434 = fVar86 * fVar85;
      fStack_430 = fVar88 * fVar87;
      fStack_42c = fVar90 * fVar89;
      fStack_428 = fVar112 * fVar91;
      auVar129._0_4_ = (float)local_440 + fVar97 * (fVar138 * fVar131 + (float)local_460._0_4_);
      auVar129._4_4_ = local_440._4_4_ + fVar103 * (fVar138 * fVar137 + (float)local_460._4_4_);
      auVar129._8_4_ = fVar84 * fVar83 + fVar104 * (fVar138 * fVar139 + fStack_458);
      auVar129._12_4_ = fVar86 * fVar85 + fVar105 * (fVar138 * fVar165 + fStack_454);
      auVar129._16_4_ = fVar88 * fVar87 + (fVar138 * fVar172 + fStack_450) * 0.0;
      auVar129._20_4_ = fVar90 * fVar89 + (fVar138 * fVar15 + fStack_44c) * 0.0;
      auVar129._24_4_ = fVar112 * fVar91 + (fVar138 * fVar19 + fStack_448) * 0.0;
      auVar129._28_4_ = fStack_424 + local_460._28_4_ + 0.0;
      fStack_2f8 = fVar84 * fStack_298;
      fStack_2f4 = fVar86 * fStack_294;
      fStack_2f0 = fVar88 * fStack_290;
      fStack_2ec = fVar90 * fStack_28c;
      fStack_2e8 = fVar112 * fStack_288;
      fStack_2e4 = local_260;
      fVar136 = auVar102._0_4_;
      auVar145._0_4_ = local_300 * fVar136;
      fVar138 = auVar102._4_4_;
      auVar145._4_4_ = fStack_2fc * fVar138;
      fVar148 = auVar102._8_4_;
      auVar145._8_4_ = fVar84 * fStack_298 * fVar148;
      fVar171 = auVar102._12_4_;
      auVar145._12_4_ = fVar86 * fStack_294 * fVar171;
      fVar14 = auVar102._16_4_;
      auVar145._16_4_ = fVar88 * fStack_290 * fVar14;
      fVar18 = auVar102._20_4_;
      auVar145._20_4_ = fVar90 * fStack_28c * fVar18;
      fVar22 = auVar102._24_4_;
      auVar145._24_4_ = fVar112 * fStack_288 * fVar22;
      auVar145._28_4_ = 0;
      auVar117 = vsubps_avx(auVar129,auVar145);
      fStack_2b8 = fVar162 * fVar83;
      fStack_2b4 = fVar163 * fVar85;
      fStack_2b0 = fVar72 * fVar87;
      fStack_2ac = fVar80 * fVar89;
      fStack_2a8 = fVar82 * fVar91;
      fStack_2a4 = 1.0;
      auVar146._0_4_ = local_2c0 + fVar97 * ((float)local_320._0_4_ + fVar142 * fVar131);
      auVar146._4_4_ = fStack_2bc + fVar103 * ((float)local_320._4_4_ + fVar142 * fVar137);
      auVar146._8_4_ = fVar162 * fVar83 + fVar104 * (fStack_318 + fVar142 * fVar139);
      auVar146._12_4_ = fVar163 * fVar85 + fVar105 * (fStack_314 + fVar142 * fVar165);
      auVar146._16_4_ = fVar72 * fVar87 + (fStack_310 + fVar142 * fVar172) * 0.0;
      auVar146._20_4_ = fVar80 * fVar89 + (fStack_30c + fVar142 * fVar15) * 0.0;
      auVar146._24_4_ = fVar82 * fVar91 + (fStack_308 + fVar142 * fVar19) * 0.0;
      auVar146._28_4_ = local_320._28_4_ + 0.0 + 1.0;
      local_80 = local_3e0._0_4_ * local_2a0;
      fStack_7c = local_3e0._4_4_ * fStack_29c;
      fStack_78 = fVar162 * fStack_298;
      fStack_74 = fVar163 * fStack_294;
      fStack_70 = fVar72 * fStack_290;
      fStack_6c = fVar80 * fStack_28c;
      fStack_68 = fVar82 * fStack_288;
      fStack_64 = fStack_424;
      auVar58._4_4_ = fStack_7c * fVar138;
      auVar58._0_4_ = local_80 * fVar136;
      auVar58._8_4_ = fVar162 * fStack_298 * fVar148;
      auVar58._12_4_ = fVar163 * fStack_294 * fVar171;
      auVar58._16_4_ = fVar72 * fStack_290 * fVar14;
      auVar58._20_4_ = fVar80 * fStack_28c * fVar18;
      auVar58._24_4_ = fVar82 * fStack_288 * fVar22;
      auVar58._28_4_ = fStack_424;
      auVar76 = vsubps_avx(auVar146,auVar58);
      auVar108 = vpmovsxwd_avx2(auVar151);
      auVar74 = vpmovsxwd_avx2(auVar69);
      local_c0._0_8_ = local_140._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar84;
      local_c0._12_4_ = -fVar86;
      local_c0._16_4_ = -fVar88;
      local_c0._20_4_ = -fVar90;
      local_c0._24_4_ = -fVar112;
      local_c0._28_4_ = local_140._28_4_ ^ 0x80000000;
      auVar102 = vblendvps_avx(local_140,local_c0,auVar74);
      local_1c0 = vblendvps_avx(auVar102,auVar117,auVar108);
      auVar183 = ZEXT3264(local_360);
      fStack_84 = auVar102._28_4_;
      local_2a0 = fVar140 * local_2a0;
      fStack_29c = fVar169 * fStack_29c;
      fStack_298 = fVar173 * fStack_298;
      fStack_294 = fVar16 * fStack_294;
      fStack_290 = fVar20 * fStack_290;
      fStack_28c = fVar23 * fStack_28c;
      fStack_288 = fVar25 * fStack_288;
      local_a0 = fVar140 * fVar73;
      fStack_9c = fVar169 * fVar81;
      fStack_98 = fVar173 * fVar83;
      fStack_94 = fVar16 * fVar85;
      fStack_90 = fVar20 * fVar87;
      fStack_8c = fVar23 * fVar89;
      fStack_88 = fVar25 * fVar91;
      auVar78._0_4_ = fVar140 * fVar73 + fVar97 * (fVar141 + fVar131 * local_260);
      auVar78._4_4_ = fVar169 * fVar81 + fVar103 * (fVar170 + fVar137 * local_260);
      auVar78._8_4_ = fVar173 * fVar83 + fVar104 * (fVar174 + fVar139 * local_260);
      auVar78._12_4_ = fVar16 * fVar85 + fVar105 * (fVar17 + fVar165 * local_260);
      auVar78._16_4_ = fVar20 * fVar87 + (fVar21 + fVar172 * local_260) * 0.0;
      auVar78._20_4_ = fVar23 * fVar89 + (fVar24 + fVar15 * local_260) * 0.0;
      auVar78._24_4_ = fVar25 * fVar91 + (fVar26 + fVar19 * local_260) * 0.0;
      auVar78._28_4_ = fStack_84 + local_340._28_4_ + auVar79._28_4_;
      auVar59._4_4_ = fStack_29c * fVar138;
      auVar59._0_4_ = local_2a0 * fVar136;
      auVar59._8_4_ = fStack_298 * fVar148;
      auVar59._12_4_ = fStack_294 * fVar171;
      auVar59._16_4_ = fStack_290 * fVar14;
      auVar59._20_4_ = fStack_28c * fVar18;
      auVar59._24_4_ = fStack_288 * fVar22;
      auVar59._28_4_ = fStack_84;
      local_e0._0_8_ = local_3e0._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar162;
      local_e0._12_4_ = -fVar163;
      local_e0._16_4_ = -fVar72;
      local_e0._20_4_ = -fVar80;
      local_e0._24_4_ = -fVar82;
      local_e0._28_4_ = local_3e0._28_4_ ^ 0x80000000;
      auVar102 = vblendvps_avx(local_3e0,local_e0,auVar74);
      auVar117 = vsubps_avx(auVar78,auVar59);
      local_1a0 = vblendvps_avx(auVar102,auVar76,auVar108);
      local_4e0._0_8_ = local_360._0_8_ ^ 0x8000000080000000;
      local_4e0._8_4_ = -fVar173;
      local_4e0._12_4_ = -fVar16;
      local_4e0._16_4_ = -fVar20;
      local_4e0._20_4_ = -fVar23;
      local_4e0._24_4_ = -fVar25;
      local_4e0._28_4_ = -fVar33;
      auVar102 = vblendvps_avx(local_360,local_4e0,auVar74);
      local_180 = vblendvps_avx(auVar102,auVar117,auVar108);
      auVar134._8_4_ = 0x3f800000;
      auVar134._0_8_ = 0x3f8000003f800000;
      auVar134._12_4_ = 0x3f800000;
      auVar134._16_4_ = 0x3f800000;
      auVar134._20_4_ = 0x3f800000;
      auVar134._24_4_ = 0x3f800000;
      auVar134._28_4_ = 0x3f800000;
      auVar102 = vandnps_avx(auVar74,auVar134);
      auVar164 = ZEXT3264(auVar102);
      auVar161 = ZEXT1664(auVar29);
      auVar60._4_4_ = fVar138 * auVar29._4_4_;
      auVar60._0_4_ = fVar136 * auVar29._0_4_;
      auVar60._8_4_ = fVar148 * auVar29._8_4_;
      auVar60._12_4_ = fVar171 * auVar29._12_4_;
      auVar60._16_4_ = fVar14 * 0.0;
      auVar60._20_4_ = fVar18 * 0.0;
      auVar60._24_4_ = fVar22 * 0.0;
      auVar60._28_4_ = auVar74._28_4_;
      local_220 = vblendvps_avx(auVar102,auVar60,auVar108);
      local_1e0._0_4_ = fVar131 + fVar106;
      local_1e0._4_4_ = fVar137 + fVar109;
      local_1e0._8_4_ = fVar139 + fVar110;
      local_1e0._12_4_ = fVar165 + fVar111;
      local_1e0._16_4_ = fVar172 + 0.0;
      local_1e0._20_4_ = fVar15 + 0.0;
      local_1e0._24_4_ = fVar19 + 0.0;
      local_1e0._28_4_ = auVar182._28_4_ + 0.0;
      fVar131 = ray->tfar;
      local_200 = ZEXT832(0) << 0x20;
      auVar69 = vpsllw_avx(auVar123,0xf);
      auVar69 = vpacksswb_avx(auVar69,auVar69);
      uVar68 = (ulong)(byte)(SUB161(auVar69 >> 7,0) & 1 | (SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar69 >> 0x37,0) & 1) << 6 | SUB161(auVar69 >> 0x3f,0) << 7);
      auVar147 = ZEXT3264(_local_460);
      auVar155 = ZEXT3264(_local_320);
      auVar175 = ZEXT3264(local_340);
      auVar119 = ZEXT3264(local_480);
      auVar179 = ZEXT3264(local_4a0);
      local_560 = context;
      local_4f0 = line;
      local_4e8 = pSVar66;
      _local_400 = auVar178;
      fStack_25c = local_260;
      fStack_258 = local_260;
      fStack_254 = local_260;
      fStack_250 = local_260;
      fStack_24c = local_260;
      fStack_248 = local_260;
      fStack_244 = local_260;
      do {
        local_520.hit = (RTCHitN *)&local_550;
        local_520.valid = &local_564;
        auVar102 = auVar164._0_32_;
        auVar159 = auVar161._0_28_;
        auVar166 = auVar168._0_28_;
        uVar28 = 0;
        for (uVar65 = uVar68; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
          uVar28 = uVar28 + 1;
        }
        local_538 = local_100[uVar28];
        pGVar11 = (pSVar66->geometries).items[local_538].ptr;
        local_520.ray = (RTCRayN *)ray;
        if ((pGVar11->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar67 = true, auVar178 = auVar179._0_32_, auVar182 = auVar183._0_32_,
             auVar117 = auVar119._0_32_, auVar76 = auVar155._0_32_, auVar108 = auVar175._0_32_,
             pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01748266;
          uVar65 = (ulong)(uint)((int)uVar28 * 4);
          local_544 = *(undefined4 *)(local_220 + uVar65);
          local_540 = *(undefined4 *)(local_200 + uVar65);
          local_53c = *(undefined4 *)((long)&(local_4f0->primIDs).field_0 + uVar65);
          local_550 = *(undefined4 *)(local_1c0 + uVar65);
          local_54c = *(undefined4 *)(local_1a0 + uVar65);
          local_548 = *(undefined4 *)(local_180 + uVar65);
          local_534 = context->user->instID[0];
          local_530 = context->user->instPrimID[0];
          ray->tfar = *(float *)(local_1e0 + uVar65);
          local_564 = -1;
          local_520.geometryUserPtr = pGVar11->userPtr;
          local_520.context = context->user;
          local_520.N = 1;
          local_554 = fVar131;
          local_420 = auVar161._0_32_;
          local_3c0 = auVar102;
          if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar11->occlusionFilterN)(&local_520), context = local_560, *local_520.valid != 0))
          {
            p_Var13 = context->args->filter;
            if ((p_Var13 == (RTCFilterFunctionN)0x0) ||
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar11->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var13)(&local_520), context = local_560, *local_520.valid != 0)))) {
              bVar67 = true;
              auVar147 = ZEXT3264(_local_460);
              auVar166 = local_280._0_28_;
              auVar159 = local_420._0_28_;
              auVar178 = local_4a0;
              auVar182 = local_360;
              auVar117 = local_480;
              auVar76 = _local_320;
              auVar108 = local_340;
              auVar102 = local_3c0;
              goto LAB_01748266;
            }
          }
          ray->tfar = local_554;
          auVar147 = ZEXT3264(_local_460);
          auVar155 = ZEXT3264(_local_320);
          auVar175 = ZEXT3264(local_340);
          auVar183 = ZEXT3264(local_360);
          auVar168 = ZEXT3264(local_280);
          auVar119 = ZEXT3264(local_480);
          auVar179 = ZEXT3264(local_4a0);
          auVar161 = ZEXT3264(local_420);
          auVar164 = ZEXT3264(local_3c0);
          pSVar66 = local_4e8;
          context = local_560;
          fVar131 = local_554;
        }
        auVar159 = auVar161._0_28_;
        auVar166 = auVar168._0_28_;
        uVar68 = uVar68 ^ 1L << (uVar28 & 0x3f);
      } while (uVar68 != 0);
      bVar67 = false;
      auVar178 = auVar179._0_32_;
      auVar182 = auVar183._0_32_;
      auVar117 = auVar119._0_32_;
      auVar76 = auVar155._0_32_;
      auVar108 = auVar175._0_32_;
      auVar102 = auVar164._0_32_;
LAB_01748266:
      fVar131 = ray->tfar;
      auVar71._4_4_ = fVar131;
      auVar71._0_4_ = fVar131;
      auVar71._8_4_ = fVar131;
      auVar71._12_4_ = fVar131;
      auVar71._16_4_ = fVar131;
      auVar71._20_4_ = fVar131;
      auVar71._24_4_ = fVar131;
      auVar71._28_4_ = fVar131;
      auVar69 = vandps_avx(local_4c0,local_150);
      auVar79 = vcmpps_avx(auVar178,auVar71,2);
      auVar123 = vpackssdw_avx(auVar79._0_16_,auVar79._16_16_);
      auVar69 = vpand_avx(auVar123,auVar69);
      auVar79 = vpmovzxwd_avx2(auVar69);
      auVar79 = vpslld_avx2(auVar79,0x1f);
      if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar79 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar79 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar79 >> 0x7f,0) == '\0') &&
            (auVar79 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar79 >> 0xbf,0) == '\0') &&
          (auVar79 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar79[0x1f])
      {
        return bVar67;
      }
      auVar27 = vcmpps_avx(local_2e0,_local_400,0);
      auVar79 = vblendvps_avx(local_140,local_c0,auVar27);
      auVar74 = vblendvps_avx(local_3e0,local_e0,auVar27);
      auVar182 = vblendvps_avx(auVar182,local_4e0,auVar27);
      auVar117 = vcmpps_avx(local_2e0,auVar117,0);
      auVar27 = vcmpps_avx(local_2e0,local_380,0);
      auVar117 = vorps_avx(auVar117,auVar27);
      fVar131 = local_2e0._0_4_;
      fVar136 = local_2e0._4_4_;
      fVar137 = local_2e0._8_4_;
      fVar138 = local_2e0._12_4_;
      fVar139 = local_2e0._16_4_;
      fVar140 = local_2e0._20_4_;
      fVar141 = local_2e0._24_4_;
      fVar148 = auVar147._28_4_;
      fVar165 = auVar166._0_4_;
      fVar169 = auVar166._4_4_;
      fVar170 = auVar166._8_4_;
      fVar171 = auVar166._12_4_;
      fVar172 = auVar166._16_4_;
      fVar173 = auVar166._20_4_;
      fVar174 = auVar166._24_4_;
      auVar118._0_4_ =
           fVar165 * (auVar147._0_4_ + fVar131 * (float)local_240._0_4_) + (float)local_440;
      auVar118._4_4_ =
           fVar169 * (auVar147._4_4_ + fVar136 * (float)local_240._4_4_) + local_440._4_4_;
      auVar118._8_4_ = fVar170 * (auVar147._8_4_ + fVar137 * fStack_238) + fStack_438;
      auVar118._12_4_ = fVar171 * (auVar147._12_4_ + fVar138 * fStack_234) + fStack_434;
      auVar118._16_4_ = fVar172 * (auVar147._16_4_ + fVar139 * fStack_230) + fStack_430;
      auVar118._20_4_ = fVar173 * (auVar147._20_4_ + fVar140 * fStack_22c) + fStack_42c;
      auVar118._24_4_ = fVar174 * (auVar147._24_4_ + fVar141 * fStack_228) + fStack_428;
      auVar118._28_4_ = fVar148 + auVar27._28_4_ + fStack_424;
      auVar130._0_4_ = fVar165 * (auVar76._0_4_ + fVar131 * (float)local_120._0_4_) + local_2c0;
      auVar130._4_4_ = fVar169 * (auVar76._4_4_ + fVar136 * (float)local_120._4_4_) + fStack_2bc;
      auVar130._8_4_ = fVar170 * (auVar76._8_4_ + fVar137 * fStack_118) + fStack_2b8;
      auVar130._12_4_ = fVar171 * (auVar76._12_4_ + fVar138 * fStack_114) + fStack_2b4;
      auVar130._16_4_ = fVar172 * (auVar76._16_4_ + fVar139 * fStack_110) + fStack_2b0;
      auVar130._20_4_ = fVar173 * (auVar76._20_4_ + fVar140 * fStack_10c) + fStack_2ac;
      auVar130._24_4_ = fVar174 * (auVar76._24_4_ + fVar141 * fStack_108) + fStack_2a8;
      auVar130._28_4_ = auVar76._28_4_ + local_380._28_4_ + fStack_2a4;
      auVar135._0_4_ = fVar165 * (auVar108._0_4_ + fVar131 * local_260) + local_a0;
      auVar135._4_4_ = fVar169 * (auVar108._4_4_ + fVar136 * fStack_25c) + fStack_9c;
      auVar135._8_4_ = fVar170 * (auVar108._8_4_ + fVar137 * fStack_258) + fStack_98;
      auVar135._12_4_ = fVar171 * (auVar108._12_4_ + fVar138 * fStack_254) + fStack_94;
      auVar135._16_4_ = fVar172 * (auVar108._16_4_ + fVar139 * fStack_250) + fStack_90;
      auVar135._20_4_ = fVar173 * (auVar108._20_4_ + fVar140 * fStack_24c) + fStack_8c;
      auVar135._24_4_ = fVar174 * (auVar108._24_4_ + fVar141 * fStack_248) + fStack_88;
      auVar135._28_4_ = auVar108._28_4_ + local_2e0._28_4_ + fStack_84;
      auVar119._0_4_ = (float)local_3a0._0_4_ * local_300;
      auVar119._4_4_ = (float)local_3a0._4_4_ * fStack_2fc;
      auVar119._8_4_ = fStack_398 * fStack_2f8;
      auVar119._12_4_ = fStack_394 * fStack_2f4;
      auVar119._16_4_ = fStack_390 * fStack_2f0;
      auVar119._20_4_ = fStack_38c * fStack_2ec;
      auVar119._28_36_ = auVar147._28_36_;
      auVar119._24_4_ = fStack_388 * fStack_2e8;
      auVar76 = vsubps_avx(auVar118,auVar119._0_32_);
      auVar61._4_4_ = (float)local_3a0._4_4_ * fStack_7c;
      auVar61._0_4_ = (float)local_3a0._0_4_ * local_80;
      auVar61._8_4_ = fStack_398 * fStack_78;
      auVar61._12_4_ = fStack_394 * fStack_74;
      auVar61._16_4_ = fStack_390 * fStack_70;
      auVar61._20_4_ = fStack_38c * fStack_6c;
      auVar61._24_4_ = fStack_388 * fStack_68;
      auVar61._28_4_ = fVar148;
      auVar108 = vsubps_avx(auVar130,auVar61);
      auVar62._4_4_ = (float)local_3a0._4_4_ * fStack_29c;
      auVar62._0_4_ = (float)local_3a0._0_4_ * local_2a0;
      auVar62._8_4_ = fStack_398 * fStack_298;
      auVar62._12_4_ = fStack_394 * fStack_294;
      auVar62._16_4_ = fStack_390 * fStack_290;
      auVar62._20_4_ = fStack_38c * fStack_28c;
      auVar62._24_4_ = fStack_388 * fStack_288;
      auVar62._28_4_ = fVar148;
      auVar27 = vsubps_avx(auVar135,auVar62);
      local_1c0 = vblendvps_avx(auVar79,auVar76,auVar117);
      local_1a0 = vblendvps_avx(auVar74,auVar108,auVar117);
      local_180 = vblendvps_avx(auVar182,auVar27,auVar117);
      auVar63._4_4_ = (float)local_3a0._4_4_ * auVar159._4_4_;
      auVar63._0_4_ = (float)local_3a0._0_4_ * auVar159._0_4_;
      auVar63._8_4_ = fStack_398 * auVar159._8_4_;
      auVar63._12_4_ = fStack_394 * auVar159._12_4_;
      auVar63._16_4_ = fStack_390 * auVar159._16_4_;
      auVar63._20_4_ = fStack_38c * auVar159._20_4_;
      auVar63._24_4_ = fStack_388 * auVar159._24_4_;
      auVar63._28_4_ = auVar76._28_4_;
      local_220 = vblendvps_avx(auVar102,auVar63,auVar117);
      local_200 = ZEXT832(0) << 0x20;
      local_1e0 = auVar178;
      auVar69 = vpsllw_avx(auVar69,0xf);
      auVar69 = vpacksswb_avx(auVar69,auVar69);
      pSVar66 = context->scene;
      uVar68 = (ulong)(byte)(SUB161(auVar69 >> 7,0) & 1 | (SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar69 >> 0x37,0) & 1) << 6 | SUB161(auVar69 >> 0x3f,0) << 7);
      do {
        local_520.hit = (RTCHitN *)&local_550;
        local_520.valid = &local_564;
        uVar28 = 0;
        for (uVar65 = uVar68; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
          uVar28 = uVar28 + 1;
        }
        local_538 = local_100[uVar28];
        pGVar11 = (pSVar66->geometries).items[local_538].ptr;
        if ((pGVar11->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar64 = 1, pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01748597;
          local_440 = pSVar66;
          uVar65 = (ulong)(uint)((int)uVar28 * 4);
          local_544 = *(undefined4 *)(local_220 + uVar65);
          local_540 = *(undefined4 *)(local_200 + uVar65);
          local_53c = *(undefined4 *)((long)&(local_4f0->primIDs).field_0 + uVar65);
          local_550 = *(undefined4 *)(local_1c0 + uVar65);
          local_54c = *(undefined4 *)(local_1a0 + uVar65);
          local_548 = *(undefined4 *)(local_180 + uVar65);
          local_534 = context->user->instID[0];
          local_530 = context->user->instPrimID[0];
          local_460._0_4_ = ray->tfar;
          ray->tfar = *(float *)(local_1e0 + uVar65);
          local_564 = -1;
          local_520.geometryUserPtr = pGVar11->userPtr;
          local_520.context = context->user;
          local_520.N = 1;
          local_520.ray = (RTCRayN *)ray;
          if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar11->occlusionFilterN)(&local_520), context = local_560, *local_520.valid != 0))
          {
            p_Var13 = context->args->filter;
            if ((p_Var13 == (RTCFilterFunctionN)0x0) ||
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar11->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var13)(&local_520), *local_520.valid != 0)))) {
              bVar64 = 1;
              goto LAB_01748597;
            }
          }
          ray->tfar = (float)local_460._0_4_;
          pSVar66 = local_440;
          context = local_560;
        }
        uVar68 = uVar68 ^ 1L << (uVar28 & 0x3f);
        if (uVar68 == 0) {
          bVar64 = 0;
LAB_01748597:
          return (bool)(bVar67 | bVar64);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
        return false;
      }